

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.hpp
# Opt level: O3

void duckdb::roaring::RoaringStateAppender<duckdb::roaring::RoaringAnalyzeState>::AppendVector
               (RoaringAnalyzeState *state,Vector *input,idx_t input_size)

{
  ushort uVar1;
  unsigned_long *puVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  uint16_t uVar7;
  ulong uVar8;
  ulong uVar9;
  byte bVar10;
  ulong uVar11;
  short sVar12;
  long lVar13;
  UnifiedVectorFormat unified;
  ulong local_b0;
  ulong local_a8;
  UnifiedVectorFormat local_78;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  Vector::ToUnifiedFormat(input,input_size,&local_78);
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0) {
    if (input_size != 0) {
      uVar11 = 0;
      do {
        uVar9 = 0x800 - (ulong)state->count;
        uVar5 = input_size - uVar11;
        if (uVar9 < input_size - uVar11) {
          uVar5 = uVar9;
        }
        state->one_count = state->one_count + (short)uVar5;
        state->last_bit_set = true;
        uVar4 = (uint)state->count + (int)uVar5;
        state->count = (uint16_t)uVar4;
        if ((uVar4 & 0xffff) == 0x800) {
          RoaringAnalyzeState::FlushContainer(state);
        }
        uVar11 = uVar11 + uVar5;
      } while (uVar11 < input_size);
    }
  }
  else if (input_size != 0) {
    local_a8 = 0;
    do {
      uVar1 = state->count;
      uVar11 = input_size - local_a8;
      if (0x800 - (ulong)uVar1 < input_size - local_a8) {
        uVar11 = 0x800 - (ulong)uVar1;
      }
      local_b0 = local_a8 >> 6;
      uVar5 = local_a8 & 0x3f;
      if (uVar5 != 0) {
        if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          uVar9 = 0xffffffffffffffff;
        }
        else {
          uVar9 = local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                  [local_b0];
        }
        uVar6 = 0x40 - uVar5;
        if (uVar11 < uVar6) {
          uVar8 = (ulong)(&ValidityUncompressed::UPPER_MASKS)[uVar11] >>
                  ((char)uVar6 - (char)uVar11 & 0x3fU);
          uVar6 = uVar11;
        }
        else {
          uVar8 = (&ValidityUncompressed::UPPER_MASKS)[uVar6];
        }
        uVar5 = (uVar8 & uVar9) >> (sbyte)uVar5;
        sVar12 = (short)uVar6;
        if (uVar5 == (&ValidityUncompressed::LOWER_MASKS)[uVar6]) {
          state->one_count = state->one_count + sVar12;
          bVar3 = true;
LAB_010440d8:
          state->last_bit_set = bVar3;
          state->count = uVar1 + sVar12;
        }
        else {
          if (uVar5 == 0) {
            if ((uVar1 == 0) || (state->last_bit_set == true)) {
              state->run_count = state->run_count + 1;
            }
            state->zero_count = state->zero_count + sVar12;
            bVar3 = false;
            goto LAB_010440d8;
          }
          AppendBytes(state,uVar5,uVar6);
        }
        uVar11 = uVar11 - uVar6;
        local_a8 = local_a8 + uVar6;
        local_b0 = local_b0 + 1;
      }
      puVar2 = local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (0x3f < uVar11) {
        uVar5 = 0;
        do {
          if ((puVar2 == (unsigned_long *)0x0) ||
             (uVar9 = puVar2[local_b0 + uVar5], uVar9 == 0xffffffffffffffff)) {
            state->one_count = state->one_count + 0x40;
            state->last_bit_set = true;
            uVar7 = state->count;
LAB_01043f43:
            state->count = uVar7 + 0x40;
          }
          else {
            if (uVar9 == 0) {
              uVar7 = state->count;
              if ((uVar7 == 0) || (state->last_bit_set == true)) {
                state->run_count = state->run_count + 1;
              }
              state->zero_count = state->zero_count + 0x40;
              state->last_bit_set = false;
              goto LAB_01043f43;
            }
            lVar13 = 0x38;
            bVar10 = 0;
            do {
              RoaringAnalyzeState::HandleByte
                        (state,(uint8_t)((0xff00000000000000U >> ((byte)lVar13 & 0x3f) & uVar9) >>
                                        (bVar10 & 0x3f)));
              lVar13 = lVar13 + -8;
              bVar10 = bVar10 + 8;
            } while (lVar13 != -8);
          }
          uVar5 = uVar5 + 1;
        } while (uVar5 != uVar11 >> 6);
      }
      uVar5 = uVar11 & 0x3f;
      if (uVar5 == 0) {
LAB_01043f9f:
        uVar7 = state->count;
      }
      else {
        if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          uVar9 = 0xffffffffffffffff;
        }
        else {
          uVar9 = local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                  [local_b0 + (uVar11 >> 6)];
        }
        uVar6 = (&ValidityUncompressed::LOWER_MASKS)[uVar5] & uVar9;
        sVar12 = (short)uVar5;
        if (uVar6 == (&ValidityUncompressed::LOWER_MASKS)[uVar5]) {
          state->one_count = state->one_count + sVar12;
          state->last_bit_set = true;
          uVar7 = sVar12 + state->count;
          state->count = uVar7;
        }
        else {
          if (uVar6 != 0) {
            AppendBytes(state,uVar9,uVar5);
            goto LAB_01043f9f;
          }
          if ((state->count == 0) || (state->last_bit_set == true)) {
            state->run_count = state->run_count + 1;
          }
          state->zero_count = state->zero_count + sVar12;
          state->last_bit_set = false;
          uVar7 = state->count + sVar12;
          state->count = uVar7;
        }
      }
      if (uVar7 == 0x800) {
        RoaringAnalyzeState::FlushContainer(state);
      }
      local_a8 = local_a8 + uVar11;
    } while (local_a8 < input_size);
  }
  if (local_78.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static void AppendVector(STATE_TYPE &state, Vector &input, idx_t input_size) {
		UnifiedVectorFormat unified;
		input.ToUnifiedFormat(input_size, unified);
		auto &validity = unified.validity;

		if (validity.AllValid()) {
			// All bits are set implicitly
			idx_t appended = 0;
			while (appended < input_size) {
				idx_t to_append =
				    MinValue<idx_t>(ROARING_CONTAINER_SIZE - STATE_TYPE::Count(state), input_size - appended);
				STATE_TYPE::HandleAllValid(state, to_append);
				if (STATE_TYPE::Count(state) == ROARING_CONTAINER_SIZE) {
					STATE_TYPE::Flush(state);
				}
				appended += to_append;
			}
		} else {
			// There is a validity mask
			idx_t appended = 0;
			while (appended < input_size) {
				idx_t to_append =
				    MinValue<idx_t>(ROARING_CONTAINER_SIZE - STATE_TYPE::Count(state), input_size - appended);

				// Deal with a ragged start, when 'appended' isn't a multiple of ValidityMask::BITS_PER_VALUE
				// then we need to process the remainder of the entry
				idx_t entry_offset = appended / ValidityMask::BITS_PER_VALUE;
				auto previous_entry_remainder = appended % ValidityMask::BITS_PER_VALUE;
				if (DUCKDB_UNLIKELY(previous_entry_remainder != 0)) {
					auto validity_entry = validity.GetValidityEntry(entry_offset);

					idx_t to_process = ValidityMask::BITS_PER_VALUE - previous_entry_remainder;
					validity_t mask;
					if (to_append < to_process) {
						// Limit the amount of bits to set
						auto left_bits = to_process - to_append;
						to_process = to_append;
						mask = ValidityUncompressed::UPPER_MASKS[to_process] >> left_bits;
					} else {
						mask = ValidityUncompressed::UPPER_MASKS[to_process];
					}

					auto masked_entry = (validity_entry & mask) >> previous_entry_remainder;
					if (masked_entry == ValidityUncompressed::LOWER_MASKS[to_process]) {
						// All bits are set
						STATE_TYPE::HandleAllValid(state, to_process);
					} else if (masked_entry == 0) {
						// None of the bits are set
						STATE_TYPE::HandleNoneValid(state, to_process);
					} else {
						// Mixed set/unset bits
						AppendBytes(state, masked_entry, to_process);
					}

					to_append -= to_process;
					appended += to_process;
					entry_offset++;
				}

				auto entry_count = to_append / ValidityMask::BITS_PER_VALUE;
				for (idx_t entry_index = 0; entry_index < entry_count; entry_index++) {
					// get the validity entry at this index
					auto validity_entry = validity.GetValidityEntry(entry_offset + entry_index);
					if (ValidityMask::AllValid(validity_entry)) {
						// All bits are set
						STATE_TYPE::HandleAllValid(state, ValidityMask::BITS_PER_VALUE);
					} else if (ValidityMask::NoneValid(validity_entry)) {
						// None of the bits are set
						STATE_TYPE::HandleNoneValid(state, ValidityMask::BITS_PER_VALUE);
					} else {
						// Mixed set/unset bits
						AppendBytes(state, validity_entry, ValidityMask::BITS_PER_VALUE);
					}
				}

				// Deal with a ragged end, when the validity entry isn't entirely used
				idx_t remainder = to_append % ValidityMask::BITS_PER_VALUE;
				if (DUCKDB_UNLIKELY(remainder != 0)) {
					auto validity_entry = validity.GetValidityEntry(entry_offset + entry_count);
					auto masked = validity_entry & ValidityUncompressed::LOWER_MASKS[remainder];
					if (masked == ValidityUncompressed::LOWER_MASKS[remainder]) {
						// All bits are set
						STATE_TYPE::HandleAllValid(state, remainder);
					} else if (masked == 0) {
						// None of the bits are set
						STATE_TYPE::HandleNoneValid(state, remainder);
					} else {
						AppendBytes(state, validity_entry, remainder);
					}
				}

				if (STATE_TYPE::Count(state) == ROARING_CONTAINER_SIZE) {
					STATE_TYPE::Flush(state);
				}
				appended += to_append;
			}
		}
	}